

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O1

MPP_RET check_re_enc(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  EncFrmType EVar1;
  MppEncRcDropFrmMode MVar2;
  ulong uVar3;
  bool bVar4;
  RK_S32 RVar5;
  int iVar6;
  RK_S32 RVar7;
  MPP_RET MVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  EVar1 = cfg->frame_type;
  iVar10 = (ctx->usr_cfg).stats_time;
  RVar5 = mpp_data_sum_v2(ctx->stat_bits);
  iVar6 = (int)((long)RVar5 / (long)iVar10);
  RVar7 = mpp_data_get_pre_val_v2(ctx->stat_bits,-1);
  uVar3 = (long)((iVar6 * iVar10 - RVar7) + cfg->bit_real) / (long)iVar10;
  uVar11 = uVar3 & 0xffffffff;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","check_re_enc",ctx);
  }
  if (((byte)rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","reenc check target_bps %d last_ins_bps %d ins_bps %d","check_re_enc"
               ,(ulong)(uint)(ctx->usr_cfg).bps_target,(long)RVar5 / (long)iVar10 & 0xffffffff,
               uVar11);
  }
  if ((ctx->usr_cfg).max_reencode_times <= ctx->reenc_cnt) {
    return MPP_OK;
  }
  MVar8 = check_super_frame(ctx,cfg);
  if (MVar8 != MPP_OK) {
    return MPP_NOK;
  }
  if (((ctx->usr_cfg).debreath_cfg.enable != 0) && (ctx->first_frm_flg == 0)) {
    return MPP_OK;
  }
  if ((rc_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"rc_model_v2","drop mode %d frame_type %d\n",(char *)0x0,
               (ulong)(ctx->usr_cfg).drop_mode,(ulong)EVar1);
  }
  MVar2 = (ctx->usr_cfg).drop_mode;
  iVar10 = (int)uVar3;
  if (EVar1 == INTER_P_FRAME && MVar2 != MPP_ENC_RC_DROP_FRM_DISABLED) {
    uVar12 = (uint)((float)(((ctx->usr_cfg).drop_thd + 100) * (ctx->usr_cfg).bps_max) * 0.01);
    if ((rc_debug._1_1_ & 2) != 0) {
      _mpp_log_l(4,"rc_model_v2","drop mode %d check max_bps %d bit_thr %d ins_bps %d",(char *)0x0,
                 (ulong)MVar2,(ulong)(uint)(ctx->usr_cfg).bps_target,(ulong)uVar12,uVar11);
    }
    return -(uint)((int)uVar12 < iVar10);
  }
  if (EVar1 == INTER_P_FRAME) {
    iVar9 = cfg->bit_target * 3;
  }
  else {
    iVar9 = 0;
    if (EVar1 == INTRA_FRAME) {
      iVar9 = (cfg->bit_target * 3) / 2;
    }
  }
  MVar8 = MPP_OK;
  if (iVar9 < cfg->bit_real) {
    if ((ctx->usr_cfg).mode == RC_CBR) {
      iVar9 = (ctx->usr_cfg).bps_target;
      if (iVar10 - iVar6 <= iVar9 / 0x14) goto LAB_0024424f;
      bVar4 = iVar10 < iVar9 - iVar9 / 10 || iVar9 / 10 + iVar9 < iVar10;
    }
    else {
      iVar9 = (ctx->usr_cfg).bps_max;
      if (iVar10 <= iVar9 - (iVar9 >> 3)) goto LAB_0024424f;
      bVar4 = iVar9 / 0x14 < iVar10 - iVar6;
    }
    MVar8 = -(uint)bVar4;
  }
LAB_0024424f:
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p ret %d\n","check_re_enc",ctx,(ulong)(uint)MVar8);
  }
  return MVar8;
}

Assistant:

MPP_RET check_re_enc(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 frame_type = cfg->frame_type;
    RK_S32 bit_thr = 0;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 last_ins_bps = mpp_data_sum_v2(ctx->stat_bits) / stat_time;
    RK_S32 ins_bps = (last_ins_bps * stat_time - mpp_data_get_pre_val_v2(ctx->stat_bits, -1)
                      + cfg->bit_real) / stat_time;
    RK_S32 target_bps;
    RK_S32 ret = MPP_OK;

    rc_dbg_func("enter %p\n", ctx);
    rc_dbg_rc("reenc check target_bps %d last_ins_bps %d ins_bps %d",
              usr_cfg->bps_target, last_ins_bps, ins_bps);

    if (ctx->reenc_cnt >= usr_cfg->max_reencode_times)
        return MPP_OK;

    if (check_super_frame(ctx, cfg))
        return MPP_NOK;

    if (usr_cfg->debreath_cfg.enable && !ctx->first_frm_flg)
        return MPP_OK;

    rc_dbg_drop("drop mode %d frame_type %d\n", usr_cfg->drop_mode, frame_type);
    if (usr_cfg->drop_mode && frame_type == INTER_P_FRAME) {
        bit_thr = (RK_S32)(usr_cfg->bps_max * (100 + usr_cfg->drop_thd) / (float)100);
        rc_dbg_drop("drop mode %d check max_bps %d bit_thr %d ins_bps %d",
                    usr_cfg->drop_mode, usr_cfg->bps_target, bit_thr, ins_bps);
        return (ins_bps > bit_thr) ? MPP_NOK : MPP_OK;
    }

    switch (frame_type) {
    case INTRA_FRAME:
        bit_thr = 3 * cfg->bit_target / 2;
        break;
    case INTER_P_FRAME:
        bit_thr = 3 * cfg->bit_target;
        break;
    default:
        break;
    }

    if (cfg->bit_real > bit_thr) {
        if (usr_cfg->mode == RC_CBR) {
            target_bps = usr_cfg->bps_target;
            if (target_bps / 20 < ins_bps - last_ins_bps &&
                (target_bps + target_bps / 10 < ins_bps
                 || target_bps - target_bps / 10 > ins_bps)) {
                ret =  MPP_NOK;
            }
        } else {
            target_bps = usr_cfg->bps_max;
            if ((target_bps - (target_bps >> 3) < ins_bps) &&
                (target_bps / 20  < ins_bps - last_ins_bps)) {
                ret =  MPP_NOK;
            }
        }
    }

    rc_dbg_func("leave %p ret %d\n", ctx, ret);
    return ret;
}